

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_toggle.c
# Opt level: O0

void toggle_loadbang(t_toggle *x,t_floatarg action)

{
  t_floatarg action_local;
  t_toggle *x_local;
  
  if (((action == 0.0) && (!NAN(action))) && (((uint)(x->x_gui).x_isa & 1) != 0)) {
    toggle_fout(x,x->x_on);
  }
  return;
}

Assistant:

static void toggle_loadbang(t_toggle *x, t_floatarg action)
{
    if (action == LB_LOAD && x->x_gui.x_isa.x_loadinit)
        toggle_fout(x, (t_float)x->x_on);
}